

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O1

int bsplitcb(const_bstring str,uchar splitChar,int pos,_func_int_void_ptr_int_int *cb,void *parm)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  uchar *puVar4;
  uint uVar5;
  int iVar6;
  
  iVar6 = -1;
  iVar2 = -1;
  if ((((-1 < pos) && (iVar2 = iVar6, str != (const_bstring)0x0)) &&
      (cb != (_func_int_void_ptr_int_int *)0x0)) && (uVar3 = (ulong)(uint)pos, pos <= str->slen)) {
    do {
      uVar1 = str->slen;
      iVar2 = (int)uVar3;
      if (iVar2 < (int)uVar1) {
        puVar4 = str->data + uVar3;
        do {
          if (*puVar4 == splitChar) goto LAB_00137844;
          uVar5 = (int)uVar3 + 1;
          uVar3 = (ulong)uVar5;
          puVar4 = puVar4 + 1;
        } while ((int)uVar5 < (int)uVar1);
        uVar3 = (ulong)uVar1;
      }
LAB_00137844:
      iVar6 = (int)uVar3;
      iVar2 = (*cb)(parm,iVar2,iVar6 - iVar2);
      if (iVar2 < 0) {
        return iVar2;
      }
      uVar3 = (ulong)(iVar6 + 1);
    } while (iVar6 < str->slen);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int bsplitcb (const_bstring str, unsigned char splitChar, int pos,
	int (* cb) (void * parm, int ofs, int len), void * parm) {
int i, p, ret;

	if (cb == NULL || str == NULL || pos < 0 || pos > str->slen)
		return BSTR_ERR;

	p = pos;
	do {
		for (i=p; i < str->slen; i++) {
			if (str->data[i] == splitChar) break;
		}
		if ((ret = cb (parm, p, i - p)) < 0) return ret;
		p = i + 1;
	} while (p <= str->slen);
	return BSTR_OK;
}